

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdLogNot(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_xor,rECX,rECX);
  EMIT_OP_REG_REG(&ctx->ctx,o_cmp,rEAX,rECX);
  EMIT_OP_REG(&ctx->ctx,o_sete,rECX);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8,rECX);
  return;
}

Assistant:

void GenCodeCmdLogNot(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rC * 8); // Load int value

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_xor, rECX, rECX);
	EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEAX, rECX);
	EMIT_OP_REG(ctx.ctx, o_sete, rECX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rECX); // Store int to target
}